

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O1

type __thiscall
duckdb::Serializer::WriteValue<duckdb_parquet::CompressionCodec::type>(Serializer *this,type value)

{
  char *pcVar1;
  undefined8 extraout_RDX;
  
  if (this[8] == (Serializer)0x1) {
    pcVar1 = EnumUtil::ToChars<duckdb_parquet::CompressionCodec::type>(value);
    (**(code **)(*(long *)this + 0xe8))(this,pcVar1,extraout_RDX,*(code **)(*(long *)this + 0xe8));
    return;
  }
  (**(code **)(*(long *)this + 0x98))(this);
  return;
}

Assistant:

typename std::enable_if<std::is_enum<T>::value, void>::type WriteValue(const T value) {
		if (options.serialize_enum_as_string) {
			// Use the enum serializer to lookup tostring function
			auto str = EnumUtil::ToChars(value);
			WriteValue(str);
		} else {
			// Use the underlying type
			WriteValue(static_cast<typename std::underlying_type<T>::type>(value));
		}
	}